

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::init_src_block_list(CTcTokenizer *this)

{
  CTcTokSrcBlock *this_00;
  char *pcVar1;
  long in_RDI;
  
  this_00 = (CTcTokSrcBlock *)operator_new(0xc358);
  CTcTokSrcBlock::CTcTokSrcBlock(this_00);
  *(CTcTokSrcBlock **)(in_RDI + 0xca8) = this_00;
  *(CTcTokSrcBlock **)(in_RDI + 0xcb0) = this_00;
  pcVar1 = CTcTokSrcBlock::get_buf(*(CTcTokSrcBlock **)(in_RDI + 0xca8));
  *(char **)(in_RDI + 0xcb8) = pcVar1;
  *(undefined8 *)(in_RDI + 0xcc0) = 50000;
  return;
}

Assistant:

void CTcTokenizer::init_src_block_list()
{
    /* allocate the first source block */
    src_cur_ = src_head_ = new CTcTokSrcBlock();

    /* set up to write into the first block */
    src_ptr_ = src_head_->get_buf();
    src_rem_ = TCTOK_SRC_BLOCK_SIZE;
}